

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall HighsDomain::backtrackToGlobal(HighsDomain *this)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  HighsBoundType HVar4;
  Reason reason;
  pointer pHVar5;
  pointer ppVar6;
  pointer pRVar7;
  pointer pRVar8;
  pointer piVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  vector<int,_std::allocator<int>_> *pvVar13;
  long lVar14;
  long lVar15;
  HighsDomainChange local_40;
  
  uVar12 = (ulong)((long)(this->domchgstack_).
                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->domchgstack_).
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 4;
  bVar3 = this->infeasible_;
  reason = this->infeasible_reason;
  iVar11 = (int)uVar12;
  bVar10 = bVar3;
  if ((bVar3 == true) && (bVar10 = 1, this->infeasible_pos == iVar11)) {
    this->infeasible_ = false;
    (this->infeasible_reason).type = -2;
    (this->infeasible_reason).index = 0;
    bVar10 = 0;
  }
  uVar12 = uVar12 & 0xffffffff;
  lVar14 = (long)iVar11;
  lVar15 = uVar12 * 0x10 + -8;
  while (0 < (int)uVar12) {
    pHVar5 = (this->domchgstack_).
             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar6 = (this->prevboundval_).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar2 = *(double *)((long)ppVar6 + lVar15 + -8);
    HVar4 = *(HighsBoundType *)((long)&pHVar5->boundval + lVar15 + 4);
    pvVar13 = &this->colUpperPos_;
    if (HVar4 == kLower) {
      pvVar13 = &this->colLowerPos_;
    }
    (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start[*(int *)((long)&pHVar5->boundval + lVar15)] = *(int *)((long)&ppVar6->first + lVar15);
    pdVar1 = (double *)((long)pHVar5 + lVar15 + -8);
    if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
      local_40.column = *(HighsInt *)((long)&pHVar5->boundval + lVar15);
      local_40.boundval = dVar2;
      local_40.boundtype = HVar4;
      doChangeBound(this,&local_40);
      bVar10 = this->infeasible_;
    }
    uVar12 = uVar12 - 1;
    if (((bVar10 & 1) != 0) && (uVar12 == (uint)this->infeasible_pos)) {
      this->infeasible_ = false;
      (this->infeasible_reason).type = -2;
      (this->infeasible_reason).index = 0;
      bVar10 = 0;
    }
    lVar14 = lVar14 + -1;
    lVar15 = lVar15 + -0x10;
  }
  if (bVar3 != false) {
    markPropagateCut(this,reason);
    (this->infeasible_reason).type = -2;
    (this->infeasible_reason).index = 0;
    this->infeasible_ = false;
  }
  pRVar7 = (this->domchgreason_).
           super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pRVar8 = (this->domchgreason_).
           super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (; lVar14 < (int)((ulong)((long)pRVar7 - (long)pRVar8) >> 3); lVar14 = lVar14 + 1) {
    markPropagateCut(this,(this->domchgreason_).
                          super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar14]);
  }
  pHVar5 = (this->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
      ._M_impl.super__Vector_impl_data._M_finish != pHVar5) {
    (this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar5;
  }
  ppVar6 = (this->prevboundval_).
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->prevboundval_).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar6) {
    (this->prevboundval_).
    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar6;
  }
  pRVar7 = (this->domchgreason_).
           super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->domchgreason_).
      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar7) {
    (this->domchgreason_).
    super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar7;
  }
  piVar9 = (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar9) {
    (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar9;
  }
  return;
}

Assistant:

void HighsDomain::backtrackToGlobal() {
  HighsInt k = HighsInt(domchgstack_.size()) - 1;
  bool old_infeasible = infeasible_;
  Reason old_reason = infeasible_reason;

  if (infeasible_ && infeasible_pos == HighsInt(domchgstack_.size())) {
    assert(old_infeasible);
    assert(k == HighsInt(domchgstack_.size()) - 1);
    infeasible_ = false;
    infeasible_reason = Reason::unspecified();
  }

  while (k >= 0) {
    double prevbound = prevboundval_[k].first;
    HighsInt prevpos = prevboundval_[k].second;
    assert(prevpos < k);

    mipsolver->mipdata_->debugSolution.boundChangeRemoved(*this,
                                                          domchgstack_[k]);

    if (domchgstack_[k].boundtype == HighsBoundType::kLower) {
      assert(colLowerPos_[domchgstack_[k].column] == k);
      colLowerPos_[domchgstack_[k].column] = prevpos;
    } else {
      assert(colUpperPos_[domchgstack_[k].column] == k);
      colUpperPos_[domchgstack_[k].column] = prevpos;
    }

    if (prevbound != domchgstack_[k].boundval) {
      // change back to global bound
      doChangeBound(
          {prevbound, domchgstack_[k].column, domchgstack_[k].boundtype});
    }

    if (infeasible_ && infeasible_pos == k) {
      assert(old_infeasible);
      assert(k == HighsInt(domchgstack_.size()) - 1);
      infeasible_ = false;
      infeasible_reason = Reason::unspecified();
    }

    --k;
  }

  if (old_infeasible) {
    markPropagateCut(old_reason);
    infeasible_reason = Reason::unspecified();
    infeasible_ = false;
  }

  HighsInt numreason = domchgreason_.size();
  for (HighsInt i = k + 1; i < numreason; ++i)
    markPropagateCut(domchgreason_[i]);

  domchgstack_.clear();
  prevboundval_.clear();
  domchgreason_.clear();
  branchPos_.clear();
}